

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

z_size_t gzfwrite(voidpc buf,z_size_t size,z_size_t nitems,gzFile file)

{
  ulong len_00;
  z_size_t zVar1;
  voidpc local_48;
  gz_statep state;
  z_size_t len;
  gzFile file_local;
  z_size_t nitems_local;
  z_size_t size_local;
  voidpc buf_local;
  
  if (file == (gzFile)0x0) {
    buf_local = (voidpc)0x0;
  }
  else if ((file[1].have == 0x79b1) && (*(int *)((long)&file[4].pos + 4) == 0)) {
    len_00 = nitems * size;
    if ((size == 0) || (len_00 / size == nitems)) {
      if (len_00 == 0) {
        local_48 = (voidpc)0x0;
      }
      else {
        zVar1 = gz_write((gz_statep)file,buf,len_00);
        local_48 = (voidpc)(zVar1 / size);
      }
      buf_local = local_48;
    }
    else {
      gz_error((gz_statep)file,-2,"request does not fit in a size_t");
      buf_local = (voidpc)0x0;
    }
  }
  else {
    buf_local = (voidpc)0x0;
  }
  return (z_size_t)buf_local;
}

Assistant:

z_size_t ZEXPORT gzfwrite(voidpc buf, z_size_t size, z_size_t nitems,
                          gzFile file) {
    z_size_t len;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* compute bytes to read -- error on overflow */
    len = nitems * size;
    if (size && len / size != nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }

    /* write len bytes to buf, return the number of full items written */
    return len ? gz_write(state, buf, len) / size : 0;
}